

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cpp
# Opt level: O0

EventLoop * __thiscall EventLoopThreadPool::getNextLoop(EventLoopThreadPool *this)

{
  bool bVar1;
  int iVar2;
  reference ppEVar3;
  EventLoop *local_18;
  EventLoop *loop;
  EventLoopThreadPool *this_local;
  
  EventLoop::assertInLoopThread(this->baseLoop_);
  if ((this->started_ & 1U) != 0) {
    local_18 = this->baseLoop_;
    bVar1 = std::vector<EventLoop_*,_std::allocator<EventLoop_*>_>::empty(&this->loops_);
    if (!bVar1) {
      ppEVar3 = std::vector<EventLoop_*,_std::allocator<EventLoop_*>_>::operator[]
                          (&this->loops_,(long)this->next_);
      local_18 = *ppEVar3;
      iVar2 = EventLoop::getConnCnt(local_18);
      if (0x8000 < iVar2) {
        this->next_ = (this->next_ + 1) % this->numThreads_;
        ppEVar3 = std::vector<EventLoop_*,_std::allocator<EventLoop_*>_>::operator[]
                            (&this->loops_,(long)this->next_);
        local_18 = *ppEVar3;
      }
      this->next_ = (this->next_ + 1) % this->numThreads_;
    }
    return local_18;
  }
  __assert_fail("started_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoopThreadPool.cpp"
                ,0x19,"EventLoop *EventLoopThreadPool::getNextLoop()");
}

Assistant:

EventLoop* EventLoopThreadPool::getNextLoop() {
    baseLoop_->assertInLoopThread();
    assert(started_);
    EventLoop* loop = baseLoop_;
    if (!loops_.empty()) {
        loop = loops_[next_]; 
        if (loop->getConnCnt() > MAXFD / 2) {
            next_ = (next_ + 1) % numThreads_;
            loop = loops_[next_];
        } 
        next_ = (next_ + 1) % numThreads_;
    }
    return loop;
}